

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O3

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improveBipartition
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  ulong *puVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pointer pRVar5;
  pointer pAVar6;
  _Bit_type *p_Var7;
  unsigned_long uVar8;
  pointer puVar9;
  ulong uVar10;
  pointer puVar11;
  bool bVar12;
  byte bVar13;
  _Hash_node_base *p_Var14;
  __node_base _Var15;
  ostream *poVar16;
  runtime_error *this_00;
  pointer pAVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  _Hash_node_base *p_Var22;
  ulong uVar23;
  undefined8 *puVar24;
  difference_type __d_1;
  ulong uVar25;
  iterator iVar26;
  _Hash_node_base *p_Var27;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var28;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  unsigned_long *v_1;
  _Hash_node_base *p_Var29;
  pair<unsigned_long,_unsigned_long> *ppVar30;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar31;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar32;
  double dVar33;
  double dVar34;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  move_edges;
  value_type *__range3_1;
  __alloc_node_gen_t __alloc_node_gen;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  size_t previousPartition;
  value_type *__range3;
  unsigned_long v;
  pair<unsigned_long,_unsigned_long> *local_1e8;
  iterator iStack_1e0;
  pair<unsigned_long,_unsigned_long> *local_1d8;
  PartitionGraph *local_1c8;
  ulong local_1c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1b8;
  undefined8 local_180;
  size_type local_178;
  undefined8 local_170;
  size_type local_168;
  undefined8 local_160;
  size_t sStack_158;
  undefined8 local_150;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_148;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  ulong local_e8;
  _Prime_rehash_policy *local_e0;
  _Prime_rehash_policy *local_d8;
  double local_d0;
  double local_c8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  size_t local_b8;
  size_t local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  unsigned_long local_90;
  ulong local_88;
  pair<unsigned_long,_unsigned_long> *local_80;
  double local_78;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> local_70;
  ulong local_68;
  ulong local_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])();
  local_48 = this->internalObjective_;
  dStack_40 = this->branchingObjective_;
  puVar2 = (this->partitionGraph_).partitions_.
           super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (pair<unsigned_long,_unsigned_long> *)0x0;
  iStack_1e0._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_1d8 = (pair<unsigned_long,_unsigned_long> *)0x0;
  p_Var29 = puVar2[partitionIdA]._M_h._M_before_begin._M_nxt;
  if (p_Var29 == (_Hash_node_base *)0x0) {
    sVar21 = 0;
  }
  else {
    local_1c8 = &this->partitionGraph_;
    local_148 = &puVar2[partitionIdA]._M_h;
    local_c0 = &puVar2[partitionIdB]._M_h;
    local_b8 = partitionIdB;
    local_b0 = partitionIdA;
    local_a8 = extraout_XMM0_Qa;
    do {
      p_Var27 = (local_c0->_M_before_begin)._M_nxt;
      if (p_Var27 != (_Hash_node_base *)0x0) {
        p_Var3 = p_Var29[1]._M_nxt;
        do {
          p_Var4 = p_Var27[1]._M_nxt;
          pRVar5 = (((this->super_HeuristicBase).data_)->problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          p_Var22 = p_Var3;
          p_Var14 = p_Var4;
          if ((ulong)((long)pRVar5[(long)p_Var4].vector_.
                            super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&pRVar5[(long)p_Var4].vector_) <
              (ulong)((long)pRVar5[(long)p_Var3].vector_.
                            super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&pRVar5[(long)p_Var3].vector_)) {
            p_Var22 = p_Var4;
            p_Var14 = p_Var3;
          }
          pAVar17 = *(pointer *)&pRVar5[(long)p_Var22].vector_;
          pAVar6 = pRVar5[(long)p_Var22].vector_.
                   super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar23 = (long)pAVar6 - (long)pAVar17 >> 4;
          while (uVar20 = uVar23, 0 < (long)uVar20) {
            uVar23 = uVar20 >> 1;
            if (*(_Hash_node_base **)(pAVar17 + uVar23) < p_Var14) {
              pAVar17 = pAVar17 + uVar23 + 1;
              uVar23 = ~uVar23 + uVar20;
            }
          }
          if ((pAVar6 != pAVar17) && ((_Hash_node_base *)pAVar17->vertex_ == p_Var14)) {
            if (iStack_1e0._M_current == local_1d8) {
              local_1b8._M_buckets = &p_Var3->_M_nxt;
              local_1b8._M_bucket_count = (size_type)p_Var4;
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_1b8);
            }
            else {
              (iStack_1e0._M_current)->first = (unsigned_long)p_Var3;
              (iStack_1e0._M_current)->second = (unsigned_long)p_Var4;
              iStack_1e0._M_current = iStack_1e0._M_current + 1;
            }
            local_1b8._M_buckets = &p_Var4->_M_nxt;
            local_1b8._M_bucket_count = (size_type)p_Var3;
            if (iStack_1e0._M_current == local_1d8) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_1b8);
            }
            else {
              (iStack_1e0._M_current)->first = (unsigned_long)p_Var4;
              (iStack_1e0._M_current)->second = (unsigned_long)p_Var3;
              iStack_1e0._M_current = iStack_1e0._M_current + 1;
            }
          }
          p_Var27 = p_Var27->_M_nxt;
        } while (p_Var27 != (_Hash_node_base *)0x0);
      }
      __ht = local_c0;
      p_Var28 = local_148;
      p_Var29 = p_Var29->_M_nxt;
    } while (p_Var29 != (_Hash_node_base *)0x0);
    if (local_1e8 == iStack_1e0._M_current) {
      sVar21 = 0;
    }
    else {
      local_1b8._M_buckets = (__buckets_ptr)0x0;
      local_1b8._M_bucket_count = local_148->_M_bucket_count;
      local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1b8._M_element_count = local_148->_M_element_count;
      local_1b8._M_rehash_policy._M_max_load_factor =
           (local_148->_M_rehash_policy)._M_max_load_factor;
      local_1b8._M_rehash_policy._4_4_ = *(undefined4 *)&(local_148->_M_rehash_policy).field_0x4;
      local_1b8._M_rehash_policy._M_next_resize = (local_148->_M_rehash_policy)._M_next_resize;
      local_1b8._M_single_bucket = (__node_base_ptr)0x0;
      local_140._M_buckets = (__buckets_ptr)&local_1b8;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_140._M_buckets,local_148,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_140);
      local_140._M_buckets = (__buckets_ptr)&local_180;
      local_180 = 0;
      local_178 = __ht->_M_bucket_count;
      local_170 = 0;
      local_168 = __ht->_M_element_count;
      local_160 = *(undefined8 *)&__ht->_M_rehash_policy;
      sStack_158 = (__ht->_M_rehash_policy)._M_next_resize;
      local_150 = 0;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_140._M_buckets,__ht,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_140);
      local_d8 = &p_Var28->_M_rehash_policy;
      local_e0 = &__ht->_M_rehash_policy;
      p_Var7 = (this->swapped_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      lVar18 = 0;
      do {
        for (puVar24 = *(undefined8 **)((long)&local_1b8._M_before_begin._M_nxt + lVar18);
            puVar24 != (undefined8 *)0x0; puVar24 = (undefined8 *)*puVar24) {
          uVar23 = puVar24[1];
          uVar20 = uVar23 + 0x3f;
          if (-1 < (long)uVar23) {
            uVar20 = uVar23;
          }
          bVar13 = (byte)uVar23 & 0x3f;
          puVar1 = p_Var7 + ((long)uVar20 >> 6) +
                            (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) +
                            0xffffffffffffffff;
          *puVar1 = *puVar1 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
        }
        lVar18 = lVar18 + 0x38;
      } while (lVar18 != 0x70);
      lVar18 = 0x38;
      do {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)((long)&local_1b8._M_buckets + lVar18));
        lVar18 = lVar18 + -0x38;
      } while (lVar18 != -0x38);
      (*(this->super_HeuristicBase)._vptr_HeuristicBase[4])(this,local_b0,local_b8);
      this->localBranchingObjective_ = extraout_XMM0_Qa_00;
      local_60 = __ht->_M_element_count + p_Var28->_M_element_count >> 1;
      local_1c0 = 0;
      local_e8 = 0;
      local_68 = local_60 + 1;
      do {
        local_88 = local_1c0;
        local_1b8._M_buckets = (__buckets_ptr)0x0;
        local_1b8._M_bucket_count = p_Var28->_M_bucket_count;
        local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1b8._M_element_count = p_Var28->_M_element_count;
        local_1b8._M_rehash_policy._M_max_load_factor = local_d8->_M_max_load_factor;
        local_1b8._M_rehash_policy._4_4_ = *(undefined4 *)&local_d8->field_0x4;
        local_1b8._M_rehash_policy._M_next_resize = local_d8->_M_next_resize;
        local_1b8._M_single_bucket = (__node_base_ptr)0x0;
        local_140._M_buckets = (__buckets_ptr)&local_1b8;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_140._M_buckets,p_Var28,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                   &local_140);
        local_180 = 0;
        local_178 = __ht->_M_bucket_count;
        local_170 = 0;
        local_168 = __ht->_M_element_count;
        local_160 = *(undefined8 *)local_e0;
        sStack_158 = local_e0->_M_next_resize;
        local_150 = 0;
        local_140._M_buckets = (__buckets_ptr)&local_180;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_140._M_buckets,__ht,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                   &local_140);
        p_Var7 = (this->visited_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        lVar18 = 0;
        do {
          for (puVar24 = *(undefined8 **)((long)&local_1b8._M_before_begin._M_nxt + lVar18);
              puVar24 != (undefined8 *)0x0; puVar24 = (undefined8 *)*puVar24) {
            uVar23 = puVar24[1];
            uVar20 = uVar23 + 0x3f;
            if (-1 < (long)uVar23) {
              uVar20 = uVar23;
            }
            bVar13 = (byte)uVar23 & 0x3f;
            puVar1 = p_Var7 + ((long)uVar20 >> 6) +
                              (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) +
                              0xffffffffffffffff;
            *puVar1 = *puVar1 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
          }
          lVar18 = lVar18 + 0x38;
        } while (lVar18 != 0x70);
        lVar18 = 0x38;
        do {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&local_1b8._M_buckets + lVar18));
          lVar18 = lVar18 + -0x38;
        } while (lVar18 != -0x38);
        if (local_1e8 == iStack_1e0._M_current) {
          local_90 = 0;
          local_a0 = INFINITY;
          local_98 = INFINITY;
          dVar31 = INFINITY;
          uVar23 = 0;
        }
        else {
          uVar23 = 0;
          dVar31 = INFINITY;
          local_98 = INFINITY;
          local_a0 = INFINITY;
          local_90 = 0;
          local_80 = iStack_1e0._M_current;
          iVar26._M_current = iStack_1e0._M_current;
          ppVar30 = local_1e8;
          do {
            uVar20 = ppVar30->first;
            uVar8 = ppVar30->second;
            puVar9 = (this->partitionGraph_).vertexLabels_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (puVar9[uVar20] == puVar9[uVar8]) {
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
              std::endl<char,std::char_traits<char>>(poVar16);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"(",1);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
              std::endl<char,std::char_traits<char>>(poVar16);
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"vertexLabels_ and partitions_ are inconsistent!");
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar19 = uVar20 + 0x3f;
            if (-1 < (long)uVar20) {
              uVar19 = uVar20;
            }
            lVar18 = (long)uVar19 >> 6;
            uVar19 = (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001);
            uVar25 = 1L << ((byte)uVar20 & 0x3f);
            if (((this->swapped_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar18 + uVar19 + 0xffffffffffffffff] >> (uVar20 & 0x3f) & 1) == 0) {
              p_Var7 = (this->visited_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar10 = p_Var7[lVar18 + uVar19 + 0xffffffffffffffff];
              if ((uVar10 & uVar25) == 0) {
                p_Var7[lVar18 + uVar19 + 0xffffffffffffffff] = uVar10 | uVar25;
                if (1 < (this->partitionGraph_).partitions_.
                        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[puVar9[uVar20]]._M_h.
                        _M_element_count) {
                  local_d0 = (double)puVar9[uVar8];
                  local_1c0 = uVar23;
                  local_c8 = (double)puVar9[uVar20];
                  local_50 = dVar31;
                  local_78 = PartitionGraph::move(local_1c8,uVar20,(size_t)local_d0);
                  dVar32 = INFINITY;
                  dVar34 = INFINITY;
                  dVar33 = INFINITY;
                  if (ABS(local_78) != INFINITY) {
                    (*(this->super_HeuristicBase)._vptr_HeuristicBase[3])(this,local_c8,local_d0);
                    local_58 = extraout_XMM0_Qa_01 - this->localBranchingObjective_;
                    local_d0 = extraout_XMM0_Qa_01;
                    PartitionGraph::move(local_1c8,uVar20,(size_t)local_c8);
                    local_c8 = this->branchingObjective_;
                    (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
                    dVar34 = local_c8 + local_58;
                    dVar32 = local_78 + local_58 + extraout_XMM0_Qa_02;
                    dVar33 = local_d0;
                  }
                  uVar23 = local_1c0;
                  iVar26._M_current = local_80;
                  dVar31 = local_50;
                  if (dVar32 < local_50 + -1e-08) {
                    uVar23 = uVar20;
                    dVar31 = dVar32;
                    local_a0 = dVar33;
                    local_98 = dVar34;
                    local_90 = uVar8;
                  }
                }
              }
            }
            ppVar30 = ppVar30 + 1;
          } while (ppVar30 != iVar26._M_current);
        }
        uVar20 = local_88;
        __ht = local_c0;
        if (ABS(dVar31) == INFINITY) break;
        dVar31 = PartitionGraph::move
                           (local_1c8,uVar23,
                            (this->partitionGraph_).vertexLabels_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_90]);
        __ht = local_c0;
        this->internalObjective_ = dVar31 + this->internalObjective_;
        this->localBranchingObjective_ = local_a0;
        this->branchingObjective_ = local_98;
        sVar21 = uVar23 + 0x3f;
        if (-1 < (long)uVar23) {
          sVar21 = uVar23;
        }
        puVar1 = (this->swapped_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 ((long)sVar21 >> 6) +
                 (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
        *puVar1 = *puVar1 | 1L << ((byte)uVar23 & 0x3f);
        (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
        local_1c0 = local_88 + 1;
        if (extraout_XMM0_Qa_03 < local_a8 + -1e-08) {
          (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
          local_48 = this->internalObjective_;
          dStack_40 = this->branchingObjective_;
          local_1b8._M_buckets = (__buckets_ptr)0x0;
          local_1b8._M_bucket_count = local_148->_M_bucket_count;
          local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_1b8._M_element_count = local_148->_M_element_count;
          local_1b8._M_rehash_policy._M_max_load_factor = local_d8->_M_max_load_factor;
          local_1b8._M_rehash_policy._4_4_ = *(undefined4 *)&local_d8->field_0x4;
          local_1b8._M_rehash_policy._M_next_resize = local_d8->_M_next_resize;
          local_1b8._M_single_bucket = (__node_base_ptr)0x0;
          local_140._M_buckets = (__buckets_ptr)&local_1b8;
          local_a8 = extraout_XMM0_Qa_04;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_140._M_buckets,local_148,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_140);
          local_180 = 0;
          local_178 = __ht->_M_bucket_count;
          local_170 = 0;
          local_168 = __ht->_M_element_count;
          local_160 = *(undefined8 *)local_e0;
          sStack_158 = local_e0->_M_next_resize;
          local_150 = 0;
          local_140._M_buckets = (__buckets_ptr)&local_180;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_140._M_buckets,__ht,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_140);
          lVar18 = 0;
          do {
            local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&local_140;
            local_140._M_buckets = (__buckets_ptr)0x0;
            local_140._M_bucket_count = *(size_type *)((long)&local_1b8._M_bucket_count + lVar18);
            local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_140._M_element_count = *(size_type *)((long)&local_1b8._M_element_count + lVar18);
            local_140._M_rehash_policy._0_8_ =
                 *(undefined8 *)((long)&local_1b8._M_rehash_policy._M_max_load_factor + lVar18);
            local_140._M_rehash_policy._M_next_resize =
                 *(size_t *)((long)&local_1b8._M_rehash_policy._M_next_resize + lVar18);
            local_140._M_single_bucket = (__node_base_ptr)0x0;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&local_1b8._M_buckets + lVar18),
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                        *)&local_108);
            if (local_140._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              puVar9 = (this->partitionGraph_).vertexLabels_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar11 = (this->bestVertexLabels_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              _Var15._M_nxt = local_140._M_before_begin._M_nxt;
              do {
                puVar11[(long)_Var15._M_nxt[1]._M_nxt] = puVar9[(long)_Var15._M_nxt[1]._M_nxt];
                _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
              } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_140);
            lVar18 = lVar18 + 0x38;
          } while (lVar18 != 0x70);
          lVar18 = 0x38;
          do {
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)((long)&local_1b8._M_buckets + lVar18));
            lVar18 = lVar18 + -0x38;
          } while (lVar18 != -0x38);
          local_e8 = local_1c0;
        }
        if (iStack_1e0._M_current != local_1e8) {
          iStack_1e0._M_current = local_1e8;
        }
        p_Var28 = local_148;
        uVar20 = local_68;
        for (p_Var29 = (local_148->_M_before_begin)._M_nxt; local_148 = p_Var28, local_68 = uVar20,
            p_Var29 != (_Hash_node_base *)0x0; p_Var29 = p_Var29->_M_nxt) {
          for (p_Var27 = (__ht->_M_before_begin)._M_nxt; p_Var27 != (_Hash_node_base *)0x0;
              p_Var27 = p_Var27->_M_nxt) {
            p_Var3 = p_Var29[1]._M_nxt;
            p_Var4 = p_Var27[1]._M_nxt;
            pRVar5 = (((this->super_HeuristicBase).data_)->problemGraph->graph_).vertices_.
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var22 = p_Var3;
            p_Var14 = p_Var4;
            if ((ulong)((long)pRVar5[(long)p_Var4].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pRVar5[(long)p_Var4].vector_) <
                (ulong)((long)pRVar5[(long)p_Var3].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pRVar5[(long)p_Var3].vector_)) {
              p_Var22 = p_Var4;
              p_Var14 = p_Var3;
            }
            pAVar17 = *(pointer *)&pRVar5[(long)p_Var22].vector_;
            pAVar6 = pRVar5[(long)p_Var22].vector_.
                     super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar23 = (long)pAVar6 - (long)pAVar17 >> 4;
            while (uVar20 = uVar23, 0 < (long)uVar20) {
              uVar23 = uVar20 >> 1;
              if (*(_Hash_node_base **)(pAVar17 + uVar23) < p_Var14) {
                pAVar17 = pAVar17 + uVar23 + 1;
                uVar23 = ~uVar23 + uVar20;
              }
            }
            if ((pAVar6 != pAVar17) && ((_Hash_node_base *)pAVar17->vertex_ == p_Var14)) {
              if (iStack_1e0._M_current == local_1d8) {
                local_1b8._M_buckets = &p_Var3->_M_nxt;
                local_1b8._M_bucket_count = (size_type)p_Var4;
                std::
                vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                          ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                            *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_1b8
                          );
              }
              else {
                (iStack_1e0._M_current)->first = (unsigned_long)p_Var3;
                (iStack_1e0._M_current)->second = (unsigned_long)p_Var4;
                iStack_1e0._M_current = iStack_1e0._M_current + 1;
              }
              local_1b8._M_buckets = &(p_Var27[1]._M_nxt)->_M_nxt;
              local_1b8._M_bucket_count = (size_type)p_Var29[1]._M_nxt;
              if (iStack_1e0._M_current == local_1d8) {
                std::
                vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                          ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                            *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_1b8
                          );
              }
              else {
                (iStack_1e0._M_current)->first = (unsigned_long)local_1b8._M_buckets;
                (iStack_1e0._M_current)->second = local_1b8._M_bucket_count;
                iStack_1e0._M_current = iStack_1e0._M_current + 1;
              }
            }
          }
          p_Var28 = local_148;
          __ht = local_c0;
          uVar20 = local_68;
        }
      } while (local_88 != local_60);
      p_Var28 = local_148;
      applyMerge(this,local_b0,local_b8);
      (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
      sVar21 = uVar20 + 1;
      if (local_a8 + -1e-08 <= extraout_XMM0_Qa_05) {
        bVar12 = local_e8 < sVar21;
        sVar21 = local_e8;
        if (bVar12) {
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    (&local_108,__ht->_M_element_count + p_Var28->_M_element_count);
          local_1b8._M_buckets = (__buckets_ptr)0x0;
          local_1b8._M_bucket_count = p_Var28->_M_bucket_count;
          local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_1b8._M_element_count = p_Var28->_M_element_count;
          local_1b8._M_rehash_policy._M_max_load_factor = local_d8->_M_max_load_factor;
          local_1b8._M_rehash_policy._4_4_ = *(undefined4 *)&local_d8->field_0x4;
          local_1b8._M_rehash_policy._M_next_resize = local_d8->_M_next_resize;
          local_1b8._M_single_bucket = (__node_base_ptr)0x0;
          local_140._M_buckets = (__buckets_ptr)&local_1b8;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_140._M_buckets,p_Var28,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_140);
          local_180 = 0;
          local_178 = __ht->_M_bucket_count;
          local_170 = 0;
          local_168 = __ht->_M_element_count;
          local_160 = *(undefined8 *)local_e0;
          sStack_158 = local_e0->_M_next_resize;
          local_150 = 0;
          local_140._M_buckets = (__buckets_ptr)&local_180;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_140._M_buckets,__ht,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_140);
          lVar18 = 0;
          do {
            local_140._M_buckets = (__buckets_ptr)0x0;
            local_140._M_bucket_count = *(size_type *)((long)&local_1b8._M_bucket_count + lVar18);
            local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_140._M_element_count = *(size_type *)((long)&local_1b8._M_element_count + lVar18);
            local_140._M_rehash_policy._0_8_ =
                 *(undefined8 *)((long)&local_1b8._M_rehash_policy._M_max_load_factor + lVar18);
            local_140._M_rehash_policy._M_next_resize =
                 *(size_t *)((long)&local_1b8._M_rehash_policy._M_next_resize + lVar18);
            local_140._M_single_bucket = (__node_base_ptr)0x0;
            local_70._M_h = (__hashtable_alloc *)&local_140;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_140,
                       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&local_1b8._M_buckets + lVar18),&local_70);
            for (_Var15._M_nxt = local_140._M_before_begin._M_nxt;
                _Var15._M_nxt != (_Hash_node_base *)0x0; _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
              local_70._M_h = (__hashtable_alloc *)_Var15._M_nxt[1]._M_nxt;
              if ((this->bestVertexLabels_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_70._M_h] !=
                  (this->partitionGraph_).vertexLabels_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_70._M_h]) {
                if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                             (iterator)
                             local_108.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_70);
                }
                else {
                  *local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)local_70._M_h;
                  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_140);
            lVar18 = lVar18 + 0x38;
          } while (lVar18 != 0x70);
          lVar18 = 0x38;
          do {
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)((long)&local_1b8._M_buckets + lVar18));
            puVar9 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            lVar18 = lVar18 + -0x38;
            p_Var28 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          } while (lVar18 != -0x38);
          for (; p_Var28 !=
                 (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)puVar9;
              p_Var28 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&p_Var28->_M_bucket_count) {
            PartitionGraph::forceMove
                      (local_1c8,(size_t)p_Var28->_M_buckets,
                       (this->bestVertexLabels_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)p_Var28->_M_buckets]);
          }
          PartitionGraph::updateEdgesOfPartition(local_1c8,local_b0);
          PartitionGraph::updateEdgesOfPartition(local_1c8,local_b8);
          this->internalObjective_ = local_48;
          this->branchingObjective_ = dStack_40;
          sVar21 = local_e8;
          if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start !=
              (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)0x0) {
            operator_delete(local_108.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_108.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            sVar21 = local_e8;
          }
        }
      }
      else {
        local_1b8._M_buckets = (__buckets_ptr)0x0;
        local_1b8._M_bucket_count = p_Var28->_M_bucket_count;
        local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1b8._M_element_count = p_Var28->_M_element_count;
        local_1b8._M_rehash_policy._M_max_load_factor = local_d8->_M_max_load_factor;
        local_1b8._M_rehash_policy._4_4_ = *(undefined4 *)&local_d8->field_0x4;
        local_1b8._M_rehash_policy._M_next_resize = local_d8->_M_next_resize;
        local_1b8._M_single_bucket = (__node_base_ptr)0x0;
        local_140._M_buckets = (__buckets_ptr)&local_1b8;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_140._M_buckets,p_Var28,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                   &local_140);
        local_180 = 0;
        local_178 = __ht->_M_bucket_count;
        local_170 = 0;
        local_168 = __ht->_M_element_count;
        local_160 = *(undefined8 *)local_e0;
        sStack_158 = local_e0->_M_next_resize;
        local_150 = 0;
        local_140._M_buckets = (__buckets_ptr)&local_180;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_140._M_buckets,__ht,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                   &local_140);
        lVar18 = 0;
        do {
          local_140._M_buckets = (__buckets_ptr)0x0;
          local_140._M_bucket_count = *(size_type *)((long)&local_1b8._M_bucket_count + lVar18);
          local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_140._M_element_count = *(size_type *)((long)&local_1b8._M_element_count + lVar18);
          local_140._M_rehash_policy._0_8_ =
               *(undefined8 *)((long)&local_1b8._M_rehash_policy._M_max_load_factor + lVar18);
          local_140._M_rehash_policy._M_next_resize =
               *(size_t *)((long)&local_1b8._M_rehash_policy._M_next_resize + lVar18);
          local_140._M_single_bucket = (__node_base_ptr)0x0;
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_140;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_140,
                     (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)((long)&local_1b8._M_buckets + lVar18),
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_108);
          if (local_140._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            puVar9 = (this->partitionGraph_).vertexLabels_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar11 = (this->bestVertexLabels_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            _Var15._M_nxt = local_140._M_before_begin._M_nxt;
            do {
              puVar11[(long)_Var15._M_nxt[1]._M_nxt] = puVar9[(long)_Var15._M_nxt[1]._M_nxt];
              _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
            } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_140);
          lVar18 = lVar18 + 0x38;
        } while (lVar18 != 0x70);
        lVar18 = 0x38;
        do {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&local_1b8._M_buckets + lVar18));
          lVar18 = lVar18 + -0x38;
        } while (lVar18 != -0x38);
      }
    }
    if (local_1e8 != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
    }
  }
  return sVar21;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improveBipartition(size_t partitionIdA,
                                                  size_t partitionIdB)
{
    size_t numberOfMoves = 0;

    size_t bestNumberOfMoves = 0;
    auto bestObjective = getObjective();
    auto bestInternalObjective = internalObjective_;
    auto bestBranchingObjective = branchingObjective_;

    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    // find moves.
    std::vector<std::pair<size_t, size_t>> move_edges;
    for (const auto v : partitionA) {
        for (const auto w : partitionB) {

            if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                move_edges.emplace_back(std::make_pair(v, w));
                move_edges.emplace_back(std::make_pair(w, v));
            }
        }
    }

    if (move_edges.empty()) {
        return 0;
    }

    // mark nodes as available for swapping.
    for (const auto& partition : { partitionA, partitionB }) {
        for (const auto& v : partition) {
            swapped_[v] = false;
        }
    }

    // start greedy search for improving moves
    localBranchingObjective_ =
        getBaselineBranchingObjective(partitionIdA, partitionIdB);

    const size_t maxMoves =
        calcMaximumMoves(partitionA.size(), partitionB.size());
    for (size_t iter = 0; iter < maxMoves + 1; ++iter) {

        Move best;

        // reset visits.
        for (const auto& partition : { partitionA, partitionB }) {
            for (const auto& v : partition) {
                visited_[v] = false;
            }
        }

        for (const auto& vw : move_edges) {

            const auto v = vw.first;
            const auto w = vw.second;

            // /* Debug
            if (partitionGraph_.vertexLabels_[v] ==
                partitionGraph_.vertexLabels_[w]) {
                std::cerr << v << "(" << partitionGraph_.vertexLabels_[v] << ")"
                          << std::endl;
                std::cerr << w << "(" << partitionGraph_.vertexLabels_[w] << ")"
                          << std::endl;
                throw std::runtime_error(
                    "vertexLabels_ and partitions_ are inconsistent!");
            }
            // */

            // prevent swapping back and forth
            if (swapped_[v] || visited_[v]) {
                continue;
            }
            visited_[v] = true;

            // dont let partitions vanish.
            // This case is handled by a complete merge.
            if (partitionGraph_.partitions_[partitionGraph_.vertexLabels_[v]]
                    .size() <= 1) {
                continue;
            }

            const auto move = proposeSingleMove(v, w);
            if (lowerThanWithEpsilon(best.obj_, move.obj_)) {
                best = move;
            }
        }

        // if no move was feasible, then stop searching for moves.
        if (std::isinf(best.obj_)) {
            break;

        } else {
            applySingleMove(best.vertex_,
                            partitionGraph_.vertexLabels_[best.other_]);
            localBranchingObjective_ = best.localBranchingObj_;
            branchingObjective_ = best.branchingObj_;
            swapped_[best.vertex_] = true;
            ++numberOfMoves;

            // keep track of the best labeling.
            if (lowerThanWithEpsilon(bestObjective, getObjective())) {

                bestObjective = getObjective();
                bestNumberOfMoves = numberOfMoves;
                bestInternalObjective = internalObjective_;
                bestBranchingObjective = branchingObjective_;

                // update best vertex labeling.
                for (auto partition : { partitionA, partitionB }) {
                    for (auto v : partition) {
                        bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                    }
                }
            }
        }

        // search new feasible moves.
        move_edges.clear();
        for (const auto& v : partitionA) {
            for (const auto& w : partitionB) {

                if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                    move_edges.emplace_back(std::make_pair(v, w));
                    move_edges.emplace_back(std::make_pair(w, v));
                }
            }
        }
    }

    // Would a merge be better?
    {
        applyMerge(partitionIdA, partitionIdB);
        ++numberOfMoves;

        if (lowerThanWithEpsilon(bestObjective, getObjective())) {

            bestNumberOfMoves = numberOfMoves;

            // update best vertex labeling.
            for (auto partition : { partitionA, partitionB }) {
                for (auto v : partition) {
                    bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                }
            }
        }
    }

    // revert to best labeling.
    if (numberOfMoves > bestNumberOfMoves) {

        std::vector<size_t> buffer;
        buffer.reserve(partitionA.size() + partitionB.size());

        for (auto partition : { partitionA, partitionB }) {
            for (auto v : partition) {
                if (bestVertexLabels_[v] != partitionGraph_.vertexLabels_[v]) {
                    buffer.push_back(v);
                }
            }
        }

        // revert partitions and labels.
        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, bestVertexLabels_[v]);
        }

        // update branching edges.
        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);

        // and revert partial objectives.
        internalObjective_ = bestInternalObjective;
        branchingObjective_ = bestBranchingObjective;
    }

    // assert(std::abs(getObjective() - bestObjective) < EPSILON);

    return bestNumberOfMoves;
}